

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O0

void __thiscall
rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::emplace<int>
          (Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *this,int *args)

{
  atomic<unsigned_long> *paVar1;
  size_t sVar2;
  Slot<int> *pSVar3;
  size_t sVar4;
  Slot<int> *slot;
  __int_type head;
  int *args_local;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *this_local;
  memory_order __b;
  memory_order __b_1;
  
  paVar1 = &this->head_;
  LOCK();
  sVar4 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pSVar3 = this->slots_;
  sVar2 = idx(this,sVar4);
  pSVar3 = pSVar3 + sVar2;
  do {
    sVar2 = turn(this,sVar4);
    std::operator&(memory_order_acquire,__memory_order_mask);
  } while (sVar2 * 2 != (pSVar3->turn).super___atomic_base<unsigned_long>._M_i);
  Slot<int>::construct<int>(pSVar3,args);
  sVar4 = turn(this,sVar4);
  std::operator&(memory_order_release,__memory_order_mask);
  (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = sVar4 * 2 + 1;
  return;
}

Assistant:

void emplace(Args &&...args) noexcept {
    static_assert(std::is_nothrow_constructible<T, Args &&...>::value,
                  "T must be nothrow constructible with Args&&...");
    auto const head = head_.fetch_add(1);
    auto &slot = slots_[idx(head)];
    while (turn(head) * 2 != slot.turn.load(std::memory_order_acquire))
      ;
    slot.construct(std::forward<Args>(args)...);
    slot.turn.store(turn(head) * 2 + 1, std::memory_order_release);
  }